

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

sysbvm_tuple_t sysbvm_stackFrame_buildStackTraceUpTo(sysbvm_stackFrameRecord_t *targetRecord)

{
  sysbvm_context_t *context_00;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  long *in_FS_OFFSET;
  sysbvm_tuple_t local_30;
  sysbvm_tuple_t currentSourcePosition;
  sysbvm_stackFrameRecord_t *stackFrameRecord;
  sysbvm_tuple_t orderedCollection;
  sysbvm_context_t *context;
  sysbvm_stackFrameRecord_t *targetRecord_local;
  
  context_00 = *(sysbvm_context_t **)(*in_FS_OFFSET + -0x18);
  sVar1 = sysbvm_orderedCollection_create(context_00);
  currentSourcePosition = *(sysbvm_tuple_t *)(*in_FS_OFFSET + -0x10);
  local_30 = 0;
  for (; currentSourcePosition != 0 &&
         (sysbvm_stackFrameRecord_t *)currentSourcePosition != targetRecord;
      currentSourcePosition = *(sysbvm_tuple_t *)currentSourcePosition) {
    if (*(int *)(currentSourcePosition + 8) == 6) {
      if (local_30 == 0) {
        local_30 = *(sysbvm_tuple_t *)(currentSourcePosition + 0x10);
      }
    }
    else if (*(int *)(currentSourcePosition + 8) == 1) {
      if (local_30 != 0) {
        sysbvm_orderedCollection_add(context_00,sVar1,local_30);
        local_30 = 0;
      }
    }
    else if (*(int *)(currentSourcePosition + 8) == 2) {
      if (local_30 != 0) {
        sysbvm_orderedCollection_add(context_00,sVar1,local_30);
      }
      sVar2 = sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord
                        (context_00,
                         (sysbvm_stackFrameBytecodeFunctionActivationRecord_t *)
                         currentSourcePosition);
      if (sVar2 != 0) {
        sysbvm_orderedCollection_add(context_00,sVar1,sVar2);
      }
      local_30 = 0;
    }
    else if (*(int *)(currentSourcePosition + 8) == 3) {
      if (local_30 != 0) {
        sysbvm_orderedCollection_add(context_00,sVar1,local_30);
      }
      sVar2 = sysbvm_bytecodeInterpreter_getSourcePositionForJitActivationRecord
                        (context_00,
                         (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t *)
                         currentSourcePosition);
      if (sVar2 != 0) {
        sysbvm_orderedCollection_add(context_00,sVar1,sVar2);
      }
      local_30 = 0;
    }
  }
  if (local_30 != 0) {
    sysbvm_orderedCollection_add(context_00,sVar1,local_30);
  }
  sVar1 = sysbvm_orderedCollection_asArray(context_00,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_stackFrame_buildStackTraceUpTo(sysbvm_stackFrameRecord_t *targetRecord)
{
    sysbvm_context_t *context = sysbvm_stackFrame_activeContext;
    sysbvm_tuple_t orderedCollection = sysbvm_orderedCollection_create(context);
    
    sysbvm_stackFrameRecord_t *stackFrameRecord = sysbvm_stackFrame_activeRecord;
    //sysbvm_tuple_t currentFunction = SYSBVM_NULL_TUPLE;
    sysbvm_tuple_t currentSourcePosition = SYSBVM_NULL_TUPLE;
    while(stackFrameRecord && stackFrameRecord != targetRecord)
    {
        if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION)
        {
            if(!currentSourcePosition)
                currentSourcePosition = ((sysbvm_stackFrameSourcePositionRecord_t*)stackFrameRecord)->sourcePosition;
        }
        else if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION)
        {
            if(currentSourcePosition)
            {
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
                currentSourcePosition = SYSBVM_NULL_TUPLE;
            }
            //currentFunction = ((sysbvm_stackFrameFunctionActivationRecord_t*)stackFrameRecord)->function;
        }
        else if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION)
        {
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = sysbvm_bytecodeInterpreter_getSourcePositionForActivationRecord(context, (sysbvm_stackFrameBytecodeFunctionActivationRecord_t*)stackFrameRecord);
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = SYSBVM_NULL_TUPLE;
        }
        else if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION)
        {
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = sysbvm_bytecodeInterpreter_getSourcePositionForJitActivationRecord(context, (sysbvm_stackFrameBytecodeFunctionJitActivationRecord_t*)stackFrameRecord);
            if(currentSourcePosition)
                sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);
            currentSourcePosition = SYSBVM_NULL_TUPLE;
        }

        stackFrameRecord = stackFrameRecord->previous;
    }

    if(currentSourcePosition)
        sysbvm_orderedCollection_add(context, orderedCollection, currentSourcePosition);

    return sysbvm_orderedCollection_asArray(context, orderedCollection);
}